

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlFreeIDCHashEntry(void *payload,xmlChar *name)

{
  xmlIDCHashEntryPtr pxVar1;
  xmlIDCHashEntryPtr_conflict n;
  xmlIDCHashEntryPtr_conflict e;
  xmlChar *name_local;
  void *payload_local;
  
  n = (xmlIDCHashEntryPtr_conflict)payload;
  while (n != (xmlIDCHashEntryPtr_conflict)0x0) {
    pxVar1 = n->next;
    (*xmlFree)(n);
    n = pxVar1;
  }
  return;
}

Assistant:

static void
xmlFreeIDCHashEntry (void *payload, const xmlChar *name ATTRIBUTE_UNUSED)
{
    xmlIDCHashEntryPtr e = payload, n;
    while (e) {
	n = e->next;
	xmlFree(e);
	e = n;
    }
}